

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall Position::Position(Position *this,Position *position,Move *move)

{
  Color CVar1;
  int i;
  int j;
  BoardBase *this_00;
  Piece *pPVar2;
  Square local_218;
  Square local_210;
  string local_208 [32];
  undefined1 local_1e8 [40];
  stringstream ss;
  ostream local_1b8 [376];
  Piece *local_40;
  Piece *pPiece;
  Square source;
  Move *move_local;
  Position *position_local;
  Position *this_local;
  
  Board::Board(&this->m_Board);
  Square::Square(&this->m_sEnPassant);
  Moves::Moves(&this->m_Moves);
  Moves::Moves(&this->m_Captures);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->m_PreviousPositions);
  CopyFrom(this,position);
  register0x00000000 = Move::Source(move);
  DevirginizeRooks(this,(Square *)((long)&pPiece + 4));
  this_00 = (BoardBase *)GetBoard(this);
  local_40 = BoardBase::Get(this_00,(Square *)((long)&pPiece + 4));
  DevirginizeKing(this,local_40);
  if (move == &NullMove) {
    CVar1 = GetColorToMove(this);
    SetColorToMove(this,!CVar1);
  }
  else {
    if (local_40 == &None.super_Piece) {
      std::__cxx11::stringstream::stringstream((stringstream *)(local_1e8 + 0x20));
      std::operator<<(local_1b8,"Illegal move: no piece found at source location for move ");
      Move::operator_cast_to_string((Move *)local_1e8);
      std::operator<<(local_1b8,(string *)local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::stringstream::str();
      Die(local_208);
      std::__cxx11::string::~string((string *)local_208);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1e8 + 0x20));
    }
    pPVar2 = Move::GetPromoteTo(move);
    if (pPVar2 == &None.super_Piece) {
      MovePiece(this,position,move);
    }
    else {
      PromotePiece(this,position,move);
    }
    local_210 = Move::Source(move);
    i = Square::I(&local_210);
    local_218 = Move::Source(move);
    j = Square::J(&local_218);
    BoardHashing::Set((BoardHashing *)&this->m_Board,i,j,&None.super_Piece);
    CVar1 = GetColorToMove(this);
    SetColorToMove(this,!CVar1);
    PushHashInHistory(this);
  }
  return;
}

Assistant:

Position( const Position &position, const Move &move )
    {
        CopyFrom( position );

        Square source = move.Source();
        DevirginizeRooks( source );

        const Piece *pPiece = GetBoard().Get( source );
        DevirginizeKing( pPiece );

        if ( &move == &NullMove )
        {
            SetColorToMove( !GetColorToMove() );
            return;
        }

        if ( pPiece == &None )
        {
            stringstream ss;
            ss << "Illegal move: no piece found at source location for move ";
            ss << ( string ) move;
            Die( ss.str() );
        }

        if ( move.GetPromoteTo() == &None )
            MovePiece( position, move );
        else
            PromotePiece( position, move );

        m_Board.Set( move.Source().I(), move.Source().J(), &None );
        SetColorToMove( !GetColorToMove() );

        PushHashInHistory();
    }